

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
ValidatorTest_ReturnUnreachable_Test::TestBody(ValidatorTest_ReturnUnreachable_Test *this)

{
  __node_base_ptr *this_00;
  char cVar1;
  Expression *pEVar2;
  Return *pRVar3;
  Name name;
  undefined1 local_480 [8];
  Module module;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> *local_88;
  HeapType local_80;
  undefined1 auStack_78 [8];
  AssertionResult gtest_ar_;
  undefined1 local_58 [40];
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> local_30;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  AssertHelper local_20;
  
  ::wasm::Module::Module((Module *)local_480);
  ::wasm::Name::Name((Name *)&module.tagsMap._M_h._M_single_bucket,"func");
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (pointer)0x0;
  local_58._16_8_ = (pointer)0x0;
  ::wasm::HeapType::HeapType(&local_80,(Signature)ZEXT816(0));
  this_00 = &module.typeIndices._M_h._M_single_bucket;
  auStack_78 = (undefined1  [8])0x0;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  pEVar2 = (Expression *)MixedArena::alloc<wasm::Unreachable>((MixedArena *)this_00);
  pRVar3 = MixedArena::alloc<wasm::Return>((MixedArena *)this_00);
  pRVar3->value = pEVar2;
  pEVar2 = (Expression *)auStack_78;
  name.super_IString.str._M_str = (char *)module.tagsMap._M_h._M_single_bucket;
  name.super_IString.str._M_len = (size_t)&local_30;
  ::wasm::Builder::makeFunction
            (name,local_88,(HeapType)local_58,
             (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_80.id,pEVar2);
  std::_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>::~_Vector_base
            ((_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_> *)auStack_78);
  std::_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>::~_Vector_base
            ((_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_58);
  cVar1 = ::wasm::WasmValidator::validate
                    ((Function *)local_58,
                     (Module *)
                     local_30._M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,(uint)local_480);
  auStack_78 = (undefined1  [8])(CONCAT71(auStack_78._1_7_,cVar1) ^ 1);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (cVar1 != '\0') {
    testing::Message::Message((Message *)&func);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,(internal *)auStack_78,
               (AssertionResult *)"WasmValidator{}.validate(func.get(), module, flags)","true",
               "false",(char *)pEVar2);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/validator.cpp"
               ,0x42,(char *)local_58._0_8_);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&func);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    std::__cxx11::string::~string((string *)local_58);
    if ((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)
        func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0x0) {
      (**(code **)(*(long *)func._M_t.
                            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                            .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_30);
  ::wasm::Module::~Module((Module *)local_480);
  return;
}

Assistant:

TEST(ValidatorTest, ReturnUnreachable) {
  Module module;
  Builder builder(module);

  // (return (unreachable)) should be invalid if a function has no return type.
  auto func =
    builder.makeFunction("func",
                         {},
                         Signature(Type::none, Type::none),
                         {},
                         builder.makeReturn(builder.makeUnreachable()));

  auto flags =
    WasmValidator::FlagValues::Globally | WasmValidator::FlagValues::Quiet;
  EXPECT_FALSE(WasmValidator{}.validate(func.get(), module, flags));
}